

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astIfNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t destination;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t condition;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_9aa73c9d gcFrame;
  sysbvm_astIfNode_t **ifNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x28);
  memset(&condition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&condition);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  destination = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sVar2 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                     *(sysbvm_tuple_t *)(*arguments + 0x28));
  sysbvm_functionBytecodeAssembler_jumpIfFalse
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,
             (sysbvm_tuple_t)gcFrameRecord.roots);
  sVar2 = sysbvm_functionBytecodeAssembler_newTemporary
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
                     *(sysbvm_tuple_t *)(*arguments + 0x20));
  if (*(long *)(*arguments + 0x30) == 0) {
    gcFrame.mergeLabel =
         sysbvm_functionBytecodeAssembler_addLiteral
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),0);
  }
  else {
    gcFrame.mergeLabel =
         sysbvm_functionBytecodeDirectCompiler_compileASTNode
                   (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                    *(sysbvm_tuple_t *)(*arguments + 0x30));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,
             gcFrame.mergeLabel);
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),destination);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
             (sysbvm_tuple_t)gcFrameRecord.roots);
  if (*(long *)(*arguments + 0x38) == 0) {
    gcFrame.trueResult =
         sysbvm_functionBytecodeAssembler_addLiteral
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),0);
  }
  else {
    gcFrame.trueResult =
         sysbvm_functionBytecodeDirectCompiler_compileASTNode
                   (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                    *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,
             gcFrame.trueResult);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),destination);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astIfNode_t **ifNode = (sysbvm_astIfNode_t**)node;
    struct {
        sysbvm_tuple_t falseLabel;
        sysbvm_tuple_t mergeLabel;
        sysbvm_tuple_t trueResult;
        sysbvm_tuple_t falseResult;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.falseLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.mergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // Emit the condition
    {
        sysbvm_tuple_t condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->conditionExpression);
        sysbvm_functionBytecodeAssembler_jumpIfFalse(context, (*compiler)->assembler, condition, gcFrame.falseLabel);
    }

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*ifNode)->super.analyzedType);

    // True branch.
    if((*ifNode)->trueExpression)
        gcFrame.trueResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->trueExpression);
    else
        gcFrame.trueResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.trueResult);
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.mergeLabel);

    // False branch.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.falseLabel);
    if((*ifNode)->falseExpression)
        gcFrame.falseResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->falseExpression);
    else
        gcFrame.falseResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.falseResult);

    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.mergeLabel);
    return gcFrame.result;
}